

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double english_word_length_cdf(int x)

{
  long lVar1;
  double dVar2;
  
  if (x < 1) {
    return 0.0;
  }
  if (x < 0x1b) {
    dVar2 = 0.0;
    lVar1 = 0;
    do {
      dVar2 = dVar2 + *(double *)((long)&DAT_0021ded0 + lVar1);
      lVar1 = lVar1 + 8;
    } while ((ulong)(uint)x << 3 != lVar1);
    return dVar2 / 0.99997;
  }
  return 1.0;
}

Assistant:

double english_word_length_cdf ( int x )

//****************************************************************************80
//
//  Purpose:
//
//    ENGLISH_WORD_LENGTH_CDF evaluates the English Word Length CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    31 July 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Henry Kucera, Winthrop Francis,
//    Computational Analysis of Present-Day American English,
//    Brown University Press, 1967.
//
//  Parameters:
//
//    Input, int X, the word length whose CDF is desired.
//
//    Output, double ENGLISH_WORD_LENGTH_CDF, the value of the CDF.
//
{
# define WORD_LENGTH_MAX 27

  double cdf;
  int i;
  double pdf_vec[WORD_LENGTH_MAX] = {
    0.03160,
    0.16975,
    0.21192,
    0.15678,
    0.10852,
    0.08524,
    0.07724,
    0.05623,
    0.04032,
    0.02766,
    0.01582,
    0.00917,
    0.00483,
    0.00262,
    0.00099,
    0.00050,
    0.00027,
    0.00022,
    0.00011,
    0.00006,
    0.00005,
    0.00002,
    0.00001,
    0.00001,
    0.00001,
    0.00001,
    0.00001 };
  double pdf_sum = 0.99997;

  if ( x < 1 )
  {
    cdf = 0.0;
  }
  else if ( x < WORD_LENGTH_MAX )
  {
    cdf = 0.0;
    for ( i = 0; i < x; i++ )
    {
      cdf = cdf + pdf_vec[i];
    }
    cdf = cdf / pdf_sum;
  }
  else if ( WORD_LENGTH_MAX <= x )
  {
    cdf = 1.0;
  }

  return cdf;
# undef WORD_LENGTH_MAX
}